

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_xml_declaration<0>(xml_document<char> *this,char **text)

{
  char *pcVar1;
  undefined8 *puVar3;
  char *pcVar2;
  
  pcVar2 = *text;
  do {
    pcVar1 = pcVar2 + 1;
    if (*pcVar2 == '?') {
      if (*pcVar1 == '>') {
        *text = pcVar2 + 2;
        return (xml_node<char> *)0x0;
      }
    }
    else if (*pcVar2 == '\0') {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
      pcVar2 = *text;
      *puVar3 = &PTR__exception_00161648;
      puVar3[1] = "unexpected end of data";
      puVar3[2] = pcVar2;
      __cxa_throw(puVar3,&parse_error::typeinfo,std::exception::~exception);
    }
    *text = pcVar1;
    pcVar2 = pcVar1;
  } while( true );
}

Assistant:

xml_node<Ch> *parse_xml_declaration(Ch *&text)
        {
            // If parsing of declaration is disabled
            if (!(Flags & parse_declaration_node))
            {
                // Skip until end of declaration
                while (text[0] != Ch('?') || text[1] != Ch('>'))
                {
                    if (!text[0])
                        RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                    ++text;
                }
                text += 2;    // Skip '?>'
                return 0;
            }

            // Create declaration
            xml_node<Ch> *declaration = this->allocate_node(node_declaration);

            // Skip whitespace before attributes or ?>
            skip<whitespace_pred, Flags>(text);

            // Parse declaration attributes
            parse_node_attributes<Flags>(text, declaration);
            
            // Skip ?>
            if (text[0] != Ch('?') || text[1] != Ch('>'))
                RAPIDXML_PARSE_ERROR("expected ?>", text);
            text += 2;
            
            return declaration;
        }